

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::SetSpentKeyState
          (CWallet *this,WalletBatch *batch,uint256 *hash,uint n,bool used,
          set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          *tx_destinations)

{
  bool bVar1;
  isminetype iVar2;
  uint uVar3;
  CWalletTx *pCVar4;
  byte in_R8B;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_bool>
  pVar5;
  CTxDestination *unaff_retaddr;
  CScript *in_stack_00000008;
  CWalletTx *srctx;
  CTxDestination dst;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  _Rb_tree_const_iterator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar6;
  CWallet *this_00;
  undefined7 in_stack_ffffffffffffff48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff28._M_node,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(AnnotatedMixin<std::recursive_mutex> *)0x16fe296);
  pCVar4 = GetWalletTx((CWallet *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (uint256 *)in_stack_ffffffffffffff28._M_node);
  if (pCVar4 != (CWalletTx *)0x0) {
    this_00 = (CWallet *)&stack0xffffffffffffffa8;
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff28._M_node,
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    bVar1 = ExtractDestination(in_stack_00000008,unaff_retaddr);
    if ((bVar1) &&
       (iVar2 = IsMine((CWallet *)CONCAT17(bVar1,in_stack_ffffffffffffff48),
                       (CTxDestination *)this_00), iVar2 != ISMINE_NO)) {
      uVar3 = (uint)(in_R8B & 1);
      bVar1 = IsAddressPreviouslySpent
                        ((CWallet *)
                         (ulong)(CONCAT14(in_R8B,in_stack_ffffffffffffff30) & 0x1ffffffff),
                         (CTxDestination *)in_stack_ffffffffffffff28._M_node);
      uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff38);
      if (uVar3 != bVar1) {
        if ((in_R8B & 1) != 0) {
          pVar5 = std::
                  set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                  ::insert((set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                            *)in_stack_ffffffffffffff28._M_node,
                           (value_type *)
                           CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
          in_stack_ffffffffffffff28 = pVar5.first._M_node;
        }
        SetAddressPreviouslySpent
                  (this_00,(WalletBatch *)CONCAT44(iVar2,uVar6),
                   (CTxDestination *)CONCAT44(uVar3,in_stack_ffffffffffffff30),
                   SUB81((ulong)in_stack_ffffffffffffff28._M_node >> 0x38,0));
      }
    }
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::SetSpentKeyState(WalletBatch& batch, const uint256& hash, unsigned int n, bool used, std::set<CTxDestination>& tx_destinations)
{
    AssertLockHeld(cs_wallet);
    const CWalletTx* srctx = GetWalletTx(hash);
    if (!srctx) return;

    CTxDestination dst;
    if (ExtractDestination(srctx->tx->vout[n].scriptPubKey, dst)) {
        if (IsMine(dst)) {
            if (used != IsAddressPreviouslySpent(dst)) {
                if (used) {
                    tx_destinations.insert(dst);
                }
                SetAddressPreviouslySpent(batch, dst, used);
            }
        }
    }
}